

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

void __thiscall testing::internal::UnitTestImpl::~UnitTestImpl(UnitTestImpl *this)

{
  TestEventRepeater *pTVar1;
  
  this->_vptr_UnitTestImpl = (_func_int **)&PTR__UnitTestImpl_0016b300;
  ForEach<std::vector<testing::TestCase*,std::allocator<testing::TestCase*>>,void(*)(testing::TestCase*)>
            (&this->test_cases_,Delete<testing::TestCase>);
  ForEach<std::vector<testing::Environment*,std::allocator<testing::Environment*>>,void(*)(testing::Environment*)>
            (&this->environments_,Delete<testing::Environment>);
  if (this->os_stack_trace_getter_ != (OsStackTraceGetterInterface *)0x0) {
    (*this->os_stack_trace_getter_->_vptr_OsStackTraceGetterInterface[1])();
  }
  ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
  ::~ThreadLocal(&this->gtest_trace_stack_);
  scoped_ptr<testing::internal::DeathTestFactory>::~scoped_ptr(&this->death_test_factory_);
  scoped_ptr<testing::internal::InternalRunDeathTestFlag>::~scoped_ptr
            (&this->internal_run_death_test_flag_);
  pTVar1 = (this->listeners_).repeater_;
  if (pTVar1 != (TestEventRepeater *)0x0) {
    (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[1])();
  }
  TestResult::~TestResult(&this->ad_hoc_test_result_);
  ParameterizedTestCaseRegistry::~ParameterizedTestCaseRegistry(&this->parameterized_test_registry_)
  ;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->test_case_indices_).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::~_Vector_base
            (&(this->test_cases_).
              super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>);
  std::_Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>::~_Vector_base
            (&(this->environments_).
              super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>);
  ThreadLocal<testing::TestPartResultReporterInterface_*>::~ThreadLocal
            (&this->per_thread_test_part_result_reporter_);
  Mutex::~Mutex(&this->global_test_part_result_reporter_mutex_);
  std::__cxx11::string::~string((string *)&this->original_working_dir_);
  return;
}

Assistant:

UnitTestImpl::~UnitTestImpl() {
  // Deletes every TestCase.
  ForEach(test_cases_, internal::Delete<TestCase>);

  // Deletes every Environment.
  ForEach(environments_, internal::Delete<Environment>);

  delete os_stack_trace_getter_;
}